

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O2

void __thiscall
graphics101::HalfEdgeTriMesh::build
          (HalfEdgeTriMesh *this,unsigned_long num_vertices,
          vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *triangles,
          Edges *edges)

{
  HalfEdgeIndices *this_00;
  directed_edge2halfedge_index_map_t *this_01;
  _Rb_tree_header *p_Var1;
  int iVar2;
  pointer pTVar3;
  pointer pvVar4;
  pointer pHVar5;
  pointer pHVar6;
  __buckets_ptr pp_Var7;
  const_iterator __position;
  ulong *puVar8;
  long lVar9;
  Index IVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  reference pvVar13;
  HalfEdge *pHVar14;
  _Rb_tree<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,graphics101::HalfEdgeTriMesh::HalfEdgeIndex,std::_Identity<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>>
  *p_Var15;
  mapped_type *pmVar16;
  long lVar17;
  HalfEdgeIndex *hei_1;
  pointer pHVar18;
  int fi;
  ulong uVar19;
  __buckets_ptr pp_Var20;
  __buckets_ptr __n;
  __node_base *p_Var21;
  HalfEdgeIndex *hei;
  long lVar22;
  pointer pHVar23;
  bool bVar24;
  unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
  vertex2outgoing_boundary_hei;
  HalfEdgeIndices boundary_heis;
  Index originating_vertex;
  directed_edge2index_map_t de2fi;
  
  de2fi._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &de2fi._M_t._M_impl.super__Rb_tree_header._M_header;
  de2fi._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  de2fi._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  de2fi._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar22 = 8;
  de2fi._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       de2fi._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar19 = 0;
      pTVar3 = (triangles->
               super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>).
               _M_impl.super__Vector_impl_data._M_start,
      uVar19 < (ulong)(((long)(triangles->
                              super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3) / 0xc);
      uVar19 = uVar19 + 1) {
    vertex2outgoing_boundary_hei._M_h._M_buckets =
         (__buckets_ptr)(long)*(int *)((long)pTVar3 + lVar22 + -8);
    vertex2outgoing_boundary_hei._M_h._M_bucket_count =
         (size_type)*(int *)((long)pTVar3 + lVar22 + -4);
    puVar8 = (ulong *)std::
                      map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                      ::operator[](&de2fi,(key_type *)&vertex2outgoing_boundary_hei);
    *puVar8 = uVar19;
    vertex2outgoing_boundary_hei._M_h._M_buckets =
         (__buckets_ptr)(long)*(int *)((long)pTVar3 + lVar22 + -4);
    vertex2outgoing_boundary_hei._M_h._M_bucket_count =
         (size_type)*(int *)((long)&pTVar3->A + lVar22);
    puVar8 = (ulong *)std::
                      map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                      ::operator[](&de2fi,(key_type *)&vertex2outgoing_boundary_hei);
    *puVar8 = uVar19;
    vertex2outgoing_boundary_hei._M_h._M_buckets =
         (__buckets_ptr)(long)*(int *)((long)&pTVar3->A + lVar22);
    vertex2outgoing_boundary_hei._M_h._M_bucket_count =
         (size_type)*(int *)((long)pTVar3 + lVar22 + -8);
    puVar8 = (ulong *)std::
                      map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                      ::operator[](&de2fi,(key_type *)&vertex2outgoing_boundary_hei);
    *puVar8 = uVar19;
    lVar22 = lVar22 + 0xc;
  }
  clear(this);
  vertex2outgoing_boundary_hei._M_h._M_buckets = (__buckets_ptr)0xffffffffffffffff;
  std::
  vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ::resize(&this->m_vertex_halfedges,num_vertices,(value_type *)&vertex2outgoing_boundary_hei);
  this_00 = &this->m_face_halfedges;
  vertex2outgoing_boundary_hei._M_h._M_buckets = (__buckets_ptr)0xffffffffffffffff;
  std::
  vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ::resize(this_00,((long)(triangles->
                          super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(triangles->
                         super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0xc,
           (value_type *)&vertex2outgoing_boundary_hei);
  vertex2outgoing_boundary_hei._M_h._M_buckets = (__buckets_ptr)0xffffffffffffffff;
  std::
  vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ::resize(&this->m_edge_halfedges,
           (long)(edges->
                 super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(edges->
                 super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3,
           (value_type *)&vertex2outgoing_boundary_hei);
  std::
  vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
  ::reserve(&this->m_halfedges,
            (long)(edges->
                  super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(edges->
                  super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 2);
  this_01 = &this->m_directed_edge2he_index;
  p_Var1 = &(this->m_directed_edge2he_index)._M_t._M_impl.super__Rb_tree_header;
  uVar19 = 0;
  do {
    pvVar4 = (edges->
             super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(edges->
                      super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) <= uVar19) {
      boundary_heis.
      super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      boundary_heis.
      super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      boundary_heis.
      super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __n = (__buckets_ptr)0x0;
      do {
        if ((__buckets_ptr)
            (((long)(this->m_halfedges).
                    super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_halfedges).
                   super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x28) <= __n) {
          vertex2outgoing_boundary_hei._M_h._M_buckets =
               &vertex2outgoing_boundary_hei._M_h._M_single_bucket;
          vertex2outgoing_boundary_hei._M_h._M_bucket_count = 1;
          p_Var21 = &vertex2outgoing_boundary_hei._M_h._M_before_begin;
          vertex2outgoing_boundary_hei._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          vertex2outgoing_boundary_hei._M_h._M_element_count = 0;
          vertex2outgoing_boundary_hei._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          vertex2outgoing_boundary_hei._M_h._M_rehash_policy._M_next_resize = 0;
          vertex2outgoing_boundary_hei._M_h._M_single_bucket = (__node_base_ptr)0x0;
          pHVar6 = boundary_heis.
                   super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pHVar18 = boundary_heis.
                         super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                         ._M_impl.super__Vector_impl_data._M_start; pHVar18 != pHVar6;
              pHVar18 = pHVar18 + 1) {
            pHVar14 = halfedge(this,pHVar18);
            pHVar14 = halfedge(this,&pHVar14->opposite_he);
            originating_vertex = pHVar14->to_vertex;
            p_Var15 = (_Rb_tree<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,graphics101::HalfEdgeTriMesh::HalfEdgeIndex,std::_Identity<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>>
                       *)std::__detail::
                         _Map_base<long,_std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<long,_std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&vertex2outgoing_boundary_hei,&originating_vertex);
            std::
            _Rb_tree<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,graphics101::HalfEdgeTriMesh::HalfEdgeIndex,std::_Identity<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>>
            ::_M_insert_unique<graphics101::HalfEdgeTriMesh::HalfEdgeIndex_const&>(p_Var15,pHVar18);
            pmVar16 = std::__detail::
                      _Map_base<long,_std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<long,_std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&vertex2outgoing_boundary_hei,&originating_vertex);
            if (1 < (pmVar16->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
              std::operator<<((ostream *)&std::cerr,"Butterfly vertex encountered.\n");
            }
          }
          pHVar6 = boundary_heis.
                   super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pHVar18 = boundary_heis.
                         super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                         ._M_impl.super__Vector_impl_data._M_start; pHVar18 != pHVar6;
              pHVar18 = pHVar18 + 1) {
            pHVar23 = (this->m_halfedges).
                      super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                      ._M_impl.super__Vector_impl_data._M_start + pHVar18->value;
            p_Var15 = (_Rb_tree<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,graphics101::HalfEdgeTriMesh::HalfEdgeIndex,std::_Identity<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>>
                       *)std::__detail::
                         _Map_base<long,_std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<long,_std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&vertex2outgoing_boundary_hei,&pHVar23->to_vertex);
            if (*(long *)(p_Var15 + 0x28) != 0) {
              __position._M_node = *(_Base_ptr *)(p_Var15 + 0x18);
              (pHVar23->next_he).value = *(Index *)(__position._M_node + 1);
              std::
              _Rb_tree<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,graphics101::HalfEdgeTriMesh::HalfEdgeIndex,std::_Identity<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>>
              ::erase_abi_cxx11_(p_Var15,__position);
            }
          }
          do {
            p_Var21 = p_Var21->_M_nxt;
            if (p_Var21 == (__node_base *)0x0) {
              std::
              _Hashtable<long,_std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::~_Hashtable(&vertex2outgoing_boundary_hei._M_h);
              std::
              _Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
              ::~_Vector_base(&boundary_heis.
                               super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                             );
              std::
              _Rb_tree<std::pair<long,_long>,_std::pair<const_std::pair<long,_long>,_long>,_std::_Select1st<std::pair<const_std::pair<long,_long>,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
              ::~_Rb_tree(&de2fi._M_t);
              return;
            }
          } while (p_Var21[7]._M_nxt == (_Hash_node_base *)0x0);
          __assert_fail("it.second.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/halfedge.cpp"
                        ,0x12a,
                        "void graphics101::HalfEdgeTriMesh::build(const unsigned long, const std::vector<Triangle> &, const Edges &)"
                       );
        }
        pvVar13 = std::
                  vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                  ::at(&this->m_halfedges,(size_type)__n);
        lVar22 = pvVar13->face;
        if (lVar22 == -1) {
          vertex2outgoing_boundary_hei._M_h._M_buckets = __n;
          std::
          vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
          ::emplace_back<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>
                    (&boundary_heis,(HalfEdgeIndex *)&vertex2outgoing_boundary_hei);
        }
        else {
          pTVar3 = (triangles->
                   super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pp_Var7 = (__buckets_ptr)pvVar13->to_vertex;
          pp_Var20 = (__buckets_ptr)(long)pTVar3[lVar22].B;
          if ((((pp_Var7 != (__buckets_ptr)(long)pTVar3[lVar22].A) &&
               (bVar24 = pp_Var7 != pp_Var20, pp_Var20 = (__buckets_ptr)(long)pTVar3[lVar22].C,
               bVar24)) &&
              (pp_Var20 = (__buckets_ptr)(long)pTVar3[lVar22].A,
              pp_Var7 != (__buckets_ptr)(long)pTVar3[lVar22].C)) ||
             (pp_Var20 == (__buckets_ptr)0xffffffffffffffff)) {
            __assert_fail("-1 != j",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/halfedge.cpp"
                          ,0x107,
                          "void graphics101::HalfEdgeTriMesh::build(const unsigned long, const std::vector<Triangle> &, const Edges &)"
                         );
          }
          vertex2outgoing_boundary_hei._M_h._M_buckets = pp_Var7;
          vertex2outgoing_boundary_hei._M_h._M_bucket_count = (size_type)pp_Var20;
          pmVar12 = std::
                    map<std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
                    ::operator[](this_01,(key_type *)&vertex2outgoing_boundary_hei);
          (pvVar13->next_he).value = pmVar12->value;
        }
        __n = (__buckets_ptr)((long)__n + 1);
      } while( true );
    }
    lVar22 = ((long)(this->m_halfedges).
                    super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_halfedges).
                   super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x28;
    vertex2outgoing_boundary_hei._M_h._M_element_count._0_4_ = 0xffffffff;
    vertex2outgoing_boundary_hei._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0xffffffffffffffff
    ;
    vertex2outgoing_boundary_hei._M_h._M_element_count._4_4_ = 0xffffffff;
    vertex2outgoing_boundary_hei._M_h._M_buckets = (__buckets_ptr)0xffffffffffffffff;
    vertex2outgoing_boundary_hei._M_h._M_bucket_count = 0xffffffffffffffff;
    vertex2outgoing_boundary_hei._M_h._M_rehash_policy._M_max_load_factor = -NAN;
    vertex2outgoing_boundary_hei._M_h._M_rehash_policy._4_4_ = 0xffffffff;
    std::
    vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
    ::emplace_back<graphics101::HalfEdgeTriMesh::HalfEdge>
              (&this->m_halfedges,(HalfEdge *)&vertex2outgoing_boundary_hei);
    pHVar23 = (this->m_halfedges).
              super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    lVar9 = ((long)pHVar23 -
            (long)(this->m_halfedges).
                  super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x28;
    vertex2outgoing_boundary_hei._M_h._M_element_count._0_4_ = 0xffffffff;
    vertex2outgoing_boundary_hei._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0xffffffffffffffff
    ;
    vertex2outgoing_boundary_hei._M_h._M_element_count._4_4_ = 0xffffffff;
    vertex2outgoing_boundary_hei._M_h._M_buckets = (__buckets_ptr)0xffffffffffffffff;
    vertex2outgoing_boundary_hei._M_h._M_bucket_count = 0xffffffffffffffff;
    vertex2outgoing_boundary_hei._M_h._M_rehash_policy._M_max_load_factor = -NAN;
    vertex2outgoing_boundary_hei._M_h._M_rehash_policy._4_4_ = 0xffffffff;
    std::
    vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
    ::emplace_back<graphics101::HalfEdgeTriMesh::HalfEdge>
              (&this->m_halfedges,(HalfEdge *)&vertex2outgoing_boundary_hei);
    pHVar5 = (this->m_halfedges).
             super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    IVar10 = anon_unknown.dwarf_859f3::directed_edge2face_index
                       (&de2fi,(long)pvVar4[uVar19].field_0.x,(long)pvVar4[uVar19].field_1.y);
    pHVar23[-1].face = IVar10;
    iVar2 = pvVar4[uVar19].field_1.y;
    pHVar23[-1].to_vertex = (long)iVar2;
    pHVar23[-1].edge = uVar19;
    IVar10 = anon_unknown.dwarf_859f3::directed_edge2face_index
                       (&de2fi,(long)iVar2,(long)pvVar4[uVar19].field_0.x);
    pHVar5[-1].face = IVar10;
    vertex2outgoing_boundary_hei._M_h._M_buckets = (__buckets_ptr)(long)pvVar4[uVar19].field_0.x;
    pHVar5[-1].to_vertex = (Index)vertex2outgoing_boundary_hei._M_h._M_buckets;
    pHVar5[-1].edge = uVar19;
    pHVar23[-1].opposite_he.value = lVar9;
    pHVar5[-1].opposite_he.value = lVar22;
    vertex2outgoing_boundary_hei._M_h._M_bucket_count = (size_type)pvVar4[uVar19].field_1.y;
    iVar11 = std::
             _Rb_tree<std::pair<long,_long>,_std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::_Select1st<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
             ::find(&this_01->_M_t,(key_type *)&vertex2outgoing_boundary_hei);
    if ((_Rb_tree_header *)iVar11._M_node != p_Var1) {
      __assert_fail("m_directed_edge2he_index.find( std::make_pair( edge[0], edge[1] ) ) == m_directed_edge2he_index.end()"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/halfedge.cpp"
                    ,0xcc,
                    "void graphics101::HalfEdgeTriMesh::build(const unsigned long, const std::vector<Triangle> &, const Edges &)"
                   );
    }
    vertex2outgoing_boundary_hei._M_h._M_buckets = (__buckets_ptr)(long)pvVar4[uVar19].field_1.y;
    vertex2outgoing_boundary_hei._M_h._M_bucket_count = (size_type)pvVar4[uVar19].field_0.x;
    iVar11 = std::
             _Rb_tree<std::pair<long,_long>,_std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::_Select1st<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
             ::find(&this_01->_M_t,(key_type *)&vertex2outgoing_boundary_hei);
    if ((_Rb_tree_header *)iVar11._M_node != p_Var1) {
      __assert_fail("m_directed_edge2he_index.find( std::make_pair( edge[1], edge[0] ) ) == m_directed_edge2he_index.end()"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/halfedge.cpp"
                    ,0xcd,
                    "void graphics101::HalfEdgeTriMesh::build(const unsigned long, const std::vector<Triangle> &, const Edges &)"
                   );
    }
    vertex2outgoing_boundary_hei._M_h._M_buckets = (__buckets_ptr)(long)pvVar4[uVar19].field_0.x;
    vertex2outgoing_boundary_hei._M_h._M_bucket_count = (size_type)pvVar4[uVar19].field_1.y;
    pmVar12 = std::
              map<std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
              ::operator[](this_01,(key_type *)&vertex2outgoing_boundary_hei);
    pmVar12->value = lVar22;
    vertex2outgoing_boundary_hei._M_h._M_buckets = (__buckets_ptr)(long)pvVar4[uVar19].field_1.y;
    vertex2outgoing_boundary_hei._M_h._M_bucket_count = (size_type)pvVar4[uVar19].field_0.x;
    pmVar12 = std::
              map<std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
              ::operator[](this_01,(key_type *)&vertex2outgoing_boundary_hei);
    pmVar12->value = lVar9;
    pHVar6 = (this->m_vertex_halfedges).
             super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pHVar6[pHVar23[-1].to_vertex].value == -1) || (pHVar5[-1].face == -1)) {
      pHVar6[pHVar23[-1].to_vertex].value = pHVar23[-1].opposite_he.value;
    }
    lVar17 = pHVar23[-1].face;
    if (lVar17 == -1 || pHVar6[pHVar5[-1].to_vertex].value == -1) {
      pHVar6[pHVar5[-1].to_vertex].value = pHVar5[-1].opposite_he.value;
      lVar17 = pHVar23[-1].face;
      if (lVar17 != -1) goto LAB_0013ca0b;
    }
    else {
LAB_0013ca0b:
      pHVar6 = (this_00->
               super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pHVar6[lVar17].value == -1) {
        pHVar6[lVar17].value = lVar22;
      }
    }
    lVar17 = pHVar5[-1].face;
    if ((lVar17 != -1) &&
       (pHVar6 = (this_00->
                 super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                 )._M_impl.super__Vector_impl_data._M_start, pHVar6[lVar17].value == -1)) {
      pHVar6[lVar17].value = lVar9;
    }
    pHVar6 = (this->m_edge_halfedges).
             super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pHVar6[uVar19].value != -1) {
      __assert_fail("m_edge_halfedges[ ei ] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/halfedge.cpp"
                    ,0xef,
                    "void graphics101::HalfEdgeTriMesh::build(const unsigned long, const std::vector<Triangle> &, const Edges &)"
                   );
    }
    pHVar6[uVar19].value = lVar22;
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

void HalfEdgeTriMesh::build( const unsigned long num_vertices, const std::vector< Triangle >& triangles, const Edges& edges )
{
    /*
    Generates all half edge data structures for the mesh given by its vertices 'self.vs'
    and faces 'self.faces'.

    Python version used heavily
    */

    directed_edge2index_map_t de2fi;
    for( int fi = 0; fi < triangles.size(); ++fi )
    {
        const Triangle& tri = triangles[fi];
        de2fi[ std::make_pair( tri[0], tri[1] ) ] = fi;
        de2fi[ std::make_pair( tri[1], tri[2] ) ] = fi;
        de2fi[ std::make_pair( tri[2], tri[0] ) ] = fi;
    }

    // Clear any previous data we store.
    clear();
    m_vertex_halfedges.resize( num_vertices, HalfEdgeIndex(-1) );
    m_face_halfedges.resize( triangles.size(), HalfEdgeIndex(-1) );
    m_edge_halfedges.resize( edges.size(), HalfEdgeIndex(-1) );
    m_halfedges.reserve( edges.size()*2 );

    for( int ei = 0; ei < edges.size(); ++ei )
    {
        const Edge& edge = edges[ei];

        // Add the HalfEdge structures to the end of the list.
        const HalfEdgeIndex he0index( m_halfedges.size() );
        m_halfedges.push_back( HalfEdge() );
        HalfEdge& he0 = m_halfedges.back();

        const HalfEdgeIndex he1index( m_halfedges.size() );
        m_halfedges.push_back( HalfEdge() );
        HalfEdge& he1 = m_halfedges.back();

        // The face will be -1 if it is a boundary half-edge.
        he0.face = directed_edge2face_index( de2fi, edge[0], edge[1] );
        he0.to_vertex = edge[1];
        he0.edge = ei;

        // The face will be -1 if it is a boundary half-edge.
        he1.face = directed_edge2face_index( de2fi, edge[1], edge[0] );
        he1.to_vertex = edge[0];
        he1.edge = ei;

        // Store the opposite half-edge index.
        he0.opposite_he = he1index;
        he1.opposite_he = he0index;

        // Also store the index in our m_directed_edge2he_index map.
        assert( m_directed_edge2he_index.find( std::make_pair( edge[0], edge[1] ) ) == m_directed_edge2he_index.end() );
        assert( m_directed_edge2he_index.find( std::make_pair( edge[1], edge[0] ) ) == m_directed_edge2he_index.end() );
        m_directed_edge2he_index[ std::make_pair( edge[0], edge[1] ) ] = he0index;
        m_directed_edge2he_index[ std::make_pair( edge[1], edge[0] ) ] = he1index;

        // If the vertex pointed to by a half-edge doesn't yet have an out-going
        // halfedge, store the opposite halfedge.
        // Also, if the vertex is a boundary vertex, make sure its
        // out-going halfedge is a boundary halfedge.
        // NOTE: Halfedge data structure can't properly handle butterfly vertices.
        //       If the mesh has butterfly vertices, there will be multiple outgoing
        //       boundary halfedges.  Because we have to pick one as the vertex's outgoing
        //       halfedge, we can't iterate over all neighbors, only a single wing of the
        //       butterfly.
        if( m_vertex_halfedges[ he0.to_vertex ] == -1 || -1 == he1.face )
        {
            m_vertex_halfedges[ he0.to_vertex ] = he0.opposite_he;
        }
        if( m_vertex_halfedges[ he1.to_vertex ] == -1 || -1 == he0.face )
        {
            m_vertex_halfedges[ he1.to_vertex ] = he1.opposite_he;
        }

        // If the face pointed to by a half-edge doesn't yet have a
        // halfedge pointing to it, store the halfedge.
        if( -1 != he0.face && m_face_halfedges[ he0.face ] == -1 )
        {
            m_face_halfedges[ he0.face ] = he0index;
        }
        if( -1 != he1.face && m_face_halfedges[ he1.face ] == -1 )
        {
            m_face_halfedges[ he1.face ] = he1index;
        }

        // Store one of the half-edges for the edge.
        assert( m_edge_halfedges[ ei ] == -1 );
        m_edge_halfedges[ ei ] = he0index;
    }

    // Now that all the half-edges are created, set the remaining next_he field.
    // We can't yet handle boundary halfedges, so store them for later.
    HalfEdgeIndices boundary_heis;
    for( int hei = 0; hei < m_halfedges.size(); ++hei )
    {
        HalfEdge& he = m_halfedges.at( hei );
        // Store boundary halfedges for later.
        if( -1 == he.face )
        {
            boundary_heis.push_back( HalfEdgeIndex( hei ) );
            continue;
        }

        const Triangle& face = triangles[ he.face ];
        const Index i = he.to_vertex;

        Index j = -1;
        if( face[0] == i ) j = face[1];
        else if( face[1] == i ) j = face[2];
        else if( face[2] == i ) j = face[0];
        assert( -1 != j );

        he.next_he = m_directed_edge2he_index[ std::make_pair(i,j) ];
    }

    // Make a map from vertices to boundary halfedges (indices) originating from them.
    // NOTE: There will only be multiple originating boundary halfedges at butterfly vertices.
    std::unordered_map< Index, std::set< HalfEdgeIndex > > vertex2outgoing_boundary_hei;
    for( const auto& hei : boundary_heis )
    {
        const Index originating_vertex = halfedge( halfedge( hei ).opposite_he ).to_vertex;
        vertex2outgoing_boundary_hei[ originating_vertex ].insert( hei );
        if( vertex2outgoing_boundary_hei[ originating_vertex ].size() > 1 )
        {
            std::cerr << "Butterfly vertex encountered.\n";
        }
    }

    // For each boundary halfedge, make its next_he one of the boundary halfedges
    // originating at its to_vertex.
    for( const auto& hei : boundary_heis )
    {
        HalfEdge& he = m_halfedges[ hei ];

        auto& outgoing = vertex2outgoing_boundary_hei[ he.to_vertex ];
        if( !outgoing.empty() )
        {
            auto outgoing_hei = outgoing.begin();
            he.next_he = *outgoing_hei;

            outgoing.erase( outgoing_hei );
        }
    }

#ifndef NDEBUG
    for( const auto& it : vertex2outgoing_boundary_hei ) { assert( it.second.empty() ); }
#endif
}